

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall libtorrent::aux::directory::next(directory *this,error_code *ec)

{
  int val;
  int *piVar1;
  dirent64 *pdVar2;
  error_category *cat;
  dirent *de;
  error_code *ec_local;
  directory *this_local;
  
  boost::system::error_code::clear(ec);
  piVar1 = __errno_location();
  *piVar1 = 0;
  pdVar2 = readdir64((DIR *)this->m_handle);
  if (pdVar2 == (dirent64 *)0x0) {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      piVar1 = __errno_location();
      val = *piVar1;
      cat = boost::system::system_category();
      boost::system::error_code::assign(ec,val,cat);
    }
    this->m_done = true;
  }
  else {
    ::std::__cxx11::string::operator=((string *)&this->m_name,pdVar2->d_name);
  }
  return;
}

Assistant:

void directory::next(error_code& ec)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		if (FindNextFileW(m_handle, &m_fd) == 0)
		{
			m_done = true;
			int err = GetLastError();
			if (err != ERROR_NO_MORE_FILES)
				ec.assign(err, system_category());
		}
#else
		struct dirent* de;
		errno = 0;
		if ((de = ::readdir(m_handle)) != nullptr)
		{
			m_name = de->d_name;
		}
		else
		{
			if (errno) ec.assign(errno, system_category());
			m_done = true;
		}
#endif
	}